

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionDispatcherMt.cpp
# Opt level: O2

void __thiscall
cbtCollisionDispatcherMt::releaseManifold
          (cbtCollisionDispatcherMt *this,cbtPersistentManifold *manifold)

{
  int iVar1;
  int iVar2;
  cbtPersistentManifold **ppcVar3;
  cbtPersistentManifold *pcVar4;
  bool bVar5;
  
  (*(this->super_cbtCollisionDispatcher).super_cbtDispatcher._vptr_cbtDispatcher[5])();
  if (this->m_batchUpdating == false) {
    iVar1 = (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_size;
    ppcVar3 = (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_data;
    iVar2 = manifold->m_index1a;
    pcVar4 = ppcVar3[iVar2];
    ppcVar3[iVar2] = ppcVar3[(long)iVar1 + -1];
    (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_data[(long)iVar1 + -1] = pcVar4;
    (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_data[iVar2]->m_index1a = iVar2;
    (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_size = iVar1 + -1;
  }
  bVar5 = cbtPoolAllocator::validPtr
                    ((this->super_cbtCollisionDispatcher).m_persistentManifoldPoolAllocator,manifold
                    );
  if (bVar5) {
    cbtPoolAllocator::freeMemory
              ((this->super_cbtCollisionDispatcher).m_persistentManifoldPoolAllocator,manifold);
    return;
  }
  cbtAlignedFreeInternal(manifold);
  return;
}

Assistant:

void cbtCollisionDispatcherMt::releaseManifold(cbtPersistentManifold* manifold)
{
	clearManifold(manifold);
	//cbtAssert( !cbtThreadsAreRunning() );
	if (!m_batchUpdating)
	{
		// batch updater will update manifold pointers array after finishing, so
		// only need to update array when not batch-updating
		int findIndex = manifold->m_index1a;
		cbtAssert(findIndex < m_manifoldsPtr.size());
		m_manifoldsPtr.swap(findIndex, m_manifoldsPtr.size() - 1);
		m_manifoldsPtr[findIndex]->m_index1a = findIndex;
		m_manifoldsPtr.pop_back();
	}

	manifold->~cbtPersistentManifold();
	if (m_persistentManifoldPoolAllocator->validPtr(manifold))
	{
		m_persistentManifoldPoolAllocator->freeMemory(manifold);
	}
	else
	{
		cbtAlignedFree(manifold);
	}
}